

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

void event_config_free(event_config *cfg)

{
  event_config_entry *ptr;
  event_config_entry **ppeVar1;
  event_config *peVar2;
  
  while (ptr = (cfg->entries).tqh_first, ptr != (event_config_entry *)0x0) {
    peVar2 = (event_config *)(ptr->next).tqe_next;
    ppeVar1 = (ptr->next).tqe_prev;
    if (peVar2 == (event_config *)0x0) {
      peVar2 = cfg;
    }
    (peVar2->entries).tqh_last = ppeVar1;
    *ppeVar1 = (ptr->next).tqe_next;
    if (ptr->avoid_method != (char *)0x0) {
      event_mm_free_(ptr->avoid_method);
    }
    event_mm_free_(ptr);
  }
  event_mm_free_(cfg);
  return;
}

Assistant:

void
event_config_free(struct event_config *cfg)
{
	struct event_config_entry *entry;

	while ((entry = TAILQ_FIRST(&cfg->entries)) != NULL) {
		TAILQ_REMOVE(&cfg->entries, entry, next);
		event_config_entry_free(entry);
	}
	mm_free(cfg);
}